

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMeshControl::InsertPeriferalMaterialObjects(TPZMHMeshControl *this)

{
  TPZMaterial *pTVar1;
  TPZGeoMesh *this_00;
  TPZCompMesh *this_01;
  TPZLagrangeMultiplier<double> *this_02;
  long *plVar2;
  long *plVar3;
  long in_RDI;
  TPZLagrangeMultiplier<double> *matright;
  TPZLagrangeMultiplier<double> *matleft;
  int dim;
  int nstate;
  int LagrangeMatIdRight;
  int LagrangeMatIdLeft;
  TPZMaterial *matPerif;
  TPZFNMatrix<4,_double> val2Flux;
  TPZFNMatrix<4,_double> val1;
  TPZMaterial *mat;
  int matid;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd80;
  int nstate_00;
  undefined8 in_stack_fffffffffffffd88;
  int matid_00;
  long *plVar4;
  TPZCompMesh *in_stack_fffffffffffffd90;
  TPZCompMesh *in_stack_fffffffffffffd98;
  TPZNullMaterial<double> *in_stack_fffffffffffffda0;
  int64_t in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  
  nstate_00 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  matid_00 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_fffffffffffffd68);
  std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x1e125ed);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  pTVar1 = TPZCompMesh::FindMaterial(in_stack_fffffffffffffd90,matid_00);
  if (pTVar1 == (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ((char *)val2Flux.fBuf[0],val2Flux.super_TPZFMatrix<double>.fWork.fNAlloc);
  }
  TPZFNMatrix<4,_double>::TPZFNMatrix
            ((TPZFNMatrix<4,_double> *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
             ,in_stack_fffffffffffffda8,(int64_t)in_stack_fffffffffffffda0,
             (double *)in_stack_fffffffffffffd98);
  TPZFNMatrix<4,_double>::TPZFNMatrix
            ((TPZFNMatrix<4,_double> *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
             ,in_stack_fffffffffffffda8,(int64_t)in_stack_fffffffffffffda0,
             (double *)in_stack_fffffffffffffd98);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  pTVar1 = TPZCompMesh::FindMaterial(in_stack_fffffffffffffd90,matid_00);
  if (pTVar1 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ((char *)val2Flux.fBuf[0],val2Flux.super_TPZFMatrix<double>.fWork.fNAlloc);
  }
  operator_new(0x50);
  TPZNullMaterial<double>::TPZNullMaterial
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  TPZCompMesh::InsertMaterialObject
            (in_stack_fffffffffffffd98,(TPZMaterial *)in_stack_fffffffffffffd90);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  pTVar1 = TPZCompMesh::FindMaterial(in_stack_fffffffffffffd90,matid_00);
  if (pTVar1 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ((char *)val2Flux.fBuf[0],val2Flux.super_TPZFMatrix<double>.fWork.fNAlloc);
  }
  operator_new(0x50);
  TPZNullMaterial<double>::TPZNullMaterial
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  TPZCompMesh::InsertMaterialObject
            (in_stack_fffffffffffffd98,(TPZMaterial *)in_stack_fffffffffffffd90);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  pTVar1 = TPZCompMesh::FindMaterial(in_stack_fffffffffffffd90,matid_00);
  if (pTVar1 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ((char *)val2Flux.fBuf[0],val2Flux.super_TPZFMatrix<double>.fWork.fNAlloc);
  }
  operator_new(0x50);
  TPZNullMaterial<double>::TPZNullMaterial
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  TPZCompMesh::InsertMaterialObject
            (in_stack_fffffffffffffd98,(TPZMaterial *)in_stack_fffffffffffffd90);
  this_00 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::Dimension(this_00);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  pTVar1 = TPZCompMesh::FindMaterial(in_stack_fffffffffffffd90,matid_00);
  if (pTVar1 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ((char *)val2Flux.fBuf[0],val2Flux.super_TPZFMatrix<double>.fWork.fNAlloc);
  }
  this_01 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  this_02 = (TPZLagrangeMultiplier<double> *)
            TPZCompMesh::FindMaterial(in_stack_fffffffffffffd90,matid_00);
  if (this_02 != (TPZLagrangeMultiplier<double> *)0x0) {
    pzinternal::DebugStopImpl
              ((char *)val2Flux.fBuf[0],val2Flux.super_TPZFMatrix<double>.fWork.fNAlloc);
  }
  plVar2 = (long *)operator_new(0x68);
  TPZLagrangeMultiplier<double>::TPZLagrangeMultiplier
            (this_02,(int)((ulong)plVar2 >> 0x20),(int)plVar2,nstate_00);
  plVar4 = plVar2;
  plVar3 = (long *)operator_new(0x68);
  TPZLagrangeMultiplier<double>::TPZLagrangeMultiplier
            (this_02,(int)((ulong)plVar4 >> 0x20),(int)plVar4,(int)((ulong)plVar3 >> 0x20));
  if ((*(byte *)(in_RDI + 0x1ca) & 1) == 0) {
    (**(code **)(*plVar2 + 200))(0x3ff0000000000000);
    (**(code **)(*plVar3 + 200))(0xbff0000000000000);
  }
  else {
    (**(code **)(*plVar2 + 200))(0xbff0000000000000);
    (**(code **)(*plVar3 + 200))(0x3ff0000000000000);
  }
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  TPZCompMesh::InsertMaterialObject(this_01,(TPZMaterial *)this_02);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  TPZCompMesh::InsertMaterialObject(this_01,(TPZMaterial *)this_02);
  TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x1e12c73);
  TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x1e12c80);
  return;
}

Assistant:

void TPZMHMeshControl::InsertPeriferalMaterialObjects()
{
    int matid = *fMaterialIds.begin();
    TPZMaterial *mat = fCMesh->FindMaterial(matid);
    if (!mat) {
        DebugStop();
    }

    TPZFNMatrix<4,STATE> val1(fNState,fNState,0.), val2Flux(fNState,1,0.);
    TPZMaterial *matPerif = nullptr;

    if (fCMesh->FindMaterial(fSkeletonMatId)) {
        DebugStop();
    }
    matPerif = new TPZNullMaterial<STATE>(fSkeletonMatId);
    fCMesh->InsertMaterialObject(matPerif);

    if (1) {
        if (fCMesh->FindMaterial(fPressureSkeletonMatId)) {
            DebugStop();
        }
        matPerif = new TPZNullMaterial<STATE>(fPressureSkeletonMatId);
        fCMesh->InsertMaterialObject(matPerif);

        if (fCMesh->FindMaterial(fSecondSkeletonMatId)) {
            DebugStop();
        }
        matPerif = new TPZNullMaterial<STATE>(fSecondSkeletonMatId);

        fCMesh->InsertMaterialObject(matPerif);


        int LagrangeMatIdLeft = 50;
        int LagrangeMatIdRight = 51;
        int nstate = fNState;
        int dim = fGMesh->Dimension();

        if (fCMesh->FindMaterial(fLagrangeMatIdLeft)) {
            DebugStop();
        }
        if (fCMesh->FindMaterial(fLagrangeMatIdRight)) {
            DebugStop();
        }
        auto *matleft = new TPZLagrangeMultiplier<STATE>(fLagrangeMatIdLeft,dim,nstate);
        auto *matright = new TPZLagrangeMultiplier<STATE>(fLagrangeMatIdRight,dim,nstate);
        if (fSwitchLagrangeSign) {
            matleft->SetMultiplier(-1.);
            matright->SetMultiplier(1.);
        }
        else
        {
            matleft->SetMultiplier(1.);
            matright->SetMultiplier(-1.);
        }
        fCMesh->InsertMaterialObject(matleft);
        fCMesh->InsertMaterialObject(matright);
    }

}